

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O0

int __thiscall lzham::code_size_histogram::init(code_size_histogram *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint8 *in_RDX;
  uint i_1;
  uint d;
  uint c;
  uint b;
  uint a;
  uint i;
  uint8 *p;
  uint8 *pCodesizes_local;
  uint num_syms_local;
  code_size_histogram *this_local;
  
  p = in_RDX;
  for (i = (uint)ctx >> 2; i != 0; i = i - 1) {
    bVar1 = p[1];
    bVar2 = p[2];
    bVar3 = p[3];
    this->m_num_codes[*p] = this->m_num_codes[*p] + 1;
    this->m_num_codes[bVar1] = this->m_num_codes[bVar1] + 1;
    this->m_num_codes[bVar2] = this->m_num_codes[bVar2] + 1;
    this->m_num_codes[bVar3] = this->m_num_codes[bVar3] + 1;
    p = p + 4;
  }
  for (uVar4 = (uint)ctx & 3; uVar4 != 0; uVar4 = uVar4 - 1) {
    this->m_num_codes[*p] = this->m_num_codes[*p] + 1;
    p = p + 1;
  }
  return 0;
}

Assistant:

void code_size_histogram::init(uint num_syms, const uint8* pCodesizes)
   {
      const uint8 *p = pCodesizes;

      for (uint i = num_syms >> 2; i; --i)
      {
         uint a = p[0]; 
         uint b = p[1];
         uint c = p[2];
         uint d = p[3];
         m_num_codes[a]++;
         m_num_codes[b]++;
         m_num_codes[c]++;
         m_num_codes[d]++;
         p += 4;
      }

      for (uint i = num_syms & 3; i; --i)
         m_num_codes[*p++]++;

      LZHAM_ASSERT(static_cast<uint>(p - pCodesizes) == num_syms);
   }